

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall yactfr::internal::JsonBioValReq::JsonBioValReq(JsonBioValReq *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Set *pSVar3;
  long lVar4;
  long *plVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_9c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9b;
  allocator local_9a;
  allocator local_99;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [16];
  long local_38 [2];
  
  std::__cxx11::string::string((string *)&local_68,"first-to-last",&local_99);
  std::__cxx11::string::string(local_48,"last-to-first",&local_9a);
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_98,__l,&local_9b,&local_9c);
  JsonValReq::JsonValReq
            ((JsonValReq *)this,(optional<yactfr::internal::JsonValKind>)0x500000001,false);
  (this->super_JsonStrValInSetReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonScalarValInSetReq_00300530;
  p_Var1 = &(this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header;
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    pSVar3 = &(this->super_JsonStrValInSetReq)._set;
  }
  else {
    p_Var2 = &local_98._M_impl.super__Rb_tree_header;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_98._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    pSVar3 = (Set *)&local_98;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_98._M_impl.super__Rb_tree_header._M_node_count;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  (pSVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_98);
  lVar4 = -0x40;
  plVar5 = local_38;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  (this->super_JsonStrValInSetReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonScalarValInSetReq_00300ac8;
  return;
}

Assistant:

explicit JsonBioValReq() :
        JsonStrValInSetReq {JsonStrValInSetReq::Set {strs::ftl, strs::ltf}}
    {
    }